

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

void huge_repeat_cb(uv_timer_t *handle)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 auStack_a8 [152];
  
  if (huge_repeat_cb::ncalls == 0) {
    if (handle == &huge_timer1) {
      huge_repeat_cb::ncalls = 1;
      return;
    }
  }
  else {
    if (handle == &tiny_timer) {
      huge_repeat_cb::ncalls = huge_repeat_cb::ncalls + 1;
      if (huge_repeat_cb::ncalls != 10) {
        return;
      }
      uv_close(&tiny_timer,0);
      uv_close(&huge_timer1,0);
      return;
    }
    huge_repeat_cb_cold_1();
  }
  huge_repeat_cb_cold_2();
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,auStack_a8);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(auStack_a8,timer_run_once_timer_cb,0,0);
    if (iVar1 != 0) goto LAB_00177a1d;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_00177a22;
    if (timer_run_once_timer_cb_called != 1) goto LAB_00177a27;
    iVar1 = uv_timer_start(auStack_a8,timer_run_once_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_00177a2c;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_00177a31;
    if (timer_run_once_timer_cb_called != 2) goto LAB_00177a36;
    uv_close(auStack_a8,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00177a40;
    }
  }
  else {
    run_test_timer_run_once_cold_1();
LAB_00177a1d:
    run_test_timer_run_once_cold_2();
LAB_00177a22:
    run_test_timer_run_once_cold_3();
LAB_00177a27:
    run_test_timer_run_once_cold_4();
LAB_00177a2c:
    run_test_timer_run_once_cold_5();
LAB_00177a31:
    run_test_timer_run_once_cold_6();
LAB_00177a36:
    run_test_timer_run_once_cold_7();
  }
  run_test_timer_run_once_cold_8();
LAB_00177a40:
  run_test_timer_run_once_cold_9();
  timer_run_once_timer_cb_called = timer_run_once_timer_cb_called + 1;
  return;
}

Assistant:

static void huge_repeat_cb(uv_timer_t* handle) {
  static int ncalls;

  if (ncalls == 0)
    ASSERT(handle == &huge_timer1);
  else
    ASSERT(handle == &tiny_timer);

  if (++ncalls == 10) {
    uv_close((uv_handle_t*) &tiny_timer, NULL);
    uv_close((uv_handle_t*) &huge_timer1, NULL);
  }
}